

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O0

void __thiscall SingleFileMuxer::~SingleFileMuxer(SingleFileMuxer *this)

{
  StreamInfo *this_00;
  bool bVar1;
  reference ppVar2;
  pair<const_int,_SingleFileMuxer::StreamInfo_*> *itr;
  iterator __end1;
  iterator __begin1;
  map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  *__range1;
  SingleFileMuxer *this_local;
  
  __end1 = std::
           map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
           ::begin(&this->m_streamInfo);
  itr = (pair<const_int,_SingleFileMuxer::StreamInfo_*> *)
        std::
        map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
        ::end(&this->m_streamInfo);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&itr);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator*
                       (&__end1);
    this_00 = ppVar2->second;
    if (this_00 != (StreamInfo *)0x0) {
      StreamInfo::~StreamInfo(this_00);
      operator_delete(this_00,0x88);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator++
              (&__end1);
  }
  std::
  map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  ::~map(&this->m_streamInfo);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->m_trackNameTmp);
  AbstractMuxer::~AbstractMuxer(&this->super_AbstractMuxer);
  return;
}

Assistant:

SingleFileMuxer::~SingleFileMuxer()
{
    for (const auto& itr : m_streamInfo) delete itr.second;
}